

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* simplify_args_abi_cxx11_(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  value_type *pvVar3;
  long in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint j;
  string arg;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  value_type *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  value_type *in_stack_fffffffffffffef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_c8 [32];
  string local_a8 [36];
  uint local_84;
  int local_80;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  int local_20;
  undefined1 local_19;
  long local_18;
  int local_c;
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1d32b8);
  local_20 = 1;
  while( true ) {
    if (local_c <= local_20) {
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this;
    }
    __a = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      while (local_20 = local_20 + 1, local_20 < local_c) {
        in_stack_ffffffffffffff00 =
             *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)(local_18 + (long)local_20 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator(&local_79);
      }
      local_80 = 2;
    }
    else {
      uVar2 = std::__cxx11::string::length();
      if (((uVar2 < 3) ||
          (in_stack_fffffffffffffef8 =
                (value_type *)std::__cxx11::string::operator[]((ulong)local_40),
          in_stack_fffffffffffffef8->_M_dataplus != (_Alloc_hider)0x2d)) ||
         (in_stack_fffffffffffffef0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::operator[]((ulong)local_40),
         in_stack_fffffffffffffef0->_M_dataplus == (_Alloc_hider)0x2d)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      else {
        local_84 = 1;
        while( true ) {
          in_stack_fffffffffffffee8 = (value_type *)(ulong)local_84;
          pvVar3 = (value_type *)std::__cxx11::string::length();
          if (pvVar3 <= in_stack_fffffffffffffee8) break;
          std::__cxx11::string::substr((ulong)local_c8,(ulong)local_40);
          std::operator+((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          std::__cxx11::string::~string(local_a8);
          std::__cxx11::string::~string(local_c8);
          local_84 = local_84 + 1;
        }
      }
      local_80 = 0;
    }
    std::__cxx11::string::~string(local_40);
    if (local_80 != 0) break;
    local_20 = local_20 + 1;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

std::vector<std::string> simplify_args(int argc, const char **argv)
{
    std::vector<std::string> r;
    for (int i = 1; i < argc; ++i) {
        std::string arg = argv[i];
        if (arg == "--") {
            // Add this arg and all remaining ones without simplification.
            r.push_back(arg);
            while ((++i) < argc)
                r.push_back(argv[i]);
            break;
        }
        // Check if it is of the form -abc and convert to -a -b -c
        if (arg.length() > 2 && arg[0] == '-' && arg[1] != '-') {
            for (unsigned j = 1; j < arg.length(); ++j) {
                r.push_back("-" + arg.substr(j, 1));
            }
        } else {
            r.push_back(arg);
        }
    }
    return r;
}